

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O1

void __thiscall
FIX::double_conversion::DoubleToStringConverter::CreateDecimalRepresentation
          (DoubleToStringConverter *this,char *decimal_digits,int length,int decimal_point,
          int digits_after_point,StringBuilder *result_builder)

{
  int iVar1;
  int iVar2;
  
  if (decimal_point < 1) {
    StringBuilder::AddCharacter(result_builder,'0');
    if (0 < digits_after_point) {
      StringBuilder::AddCharacter(result_builder,'.');
      iVar1 = decimal_point;
      if (decimal_point < 0) {
        do {
          StringBuilder::AddCharacter(result_builder,'0');
          iVar1 = iVar1 + 1;
        } while (iVar1 != 0);
      }
      iVar1 = decimal_point + digits_after_point;
      if (iVar1 < length) {
        __assert_fail("length <= digits_after_point - (-decimal_point)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x7e,
                      "void FIX::double_conversion::DoubleToStringConverter::CreateDecimalRepresentation(const char *, int, int, int, StringBuilder *) const"
                     );
      }
      StringBuilder::AddSubstring(result_builder,decimal_digits,length);
      iVar2 = iVar1 - length;
      if (iVar2 != 0 && length <= iVar1) {
        do {
          StringBuilder::AddCharacter(result_builder,'0');
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
    }
  }
  else if (decimal_point < length) {
    if (digits_after_point < 1) {
      __assert_fail("digits_after_point > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x8d,
                    "void FIX::double_conversion::DoubleToStringConverter::CreateDecimalRepresentation(const char *, int, int, int, StringBuilder *) const"
                   );
    }
    StringBuilder::AddSubstring(result_builder,decimal_digits,decimal_point);
    StringBuilder::AddCharacter(result_builder,'.');
    iVar1 = length - decimal_point;
    if (digits_after_point < iVar1) {
      __assert_fail("length - decimal_point <= digits_after_point",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x90,
                    "void FIX::double_conversion::DoubleToStringConverter::CreateDecimalRepresentation(const char *, int, int, int, StringBuilder *) const"
                   );
    }
    StringBuilder::AddSubstring(result_builder,decimal_digits + (uint)decimal_point,iVar1);
    iVar2 = digits_after_point - iVar1;
    if (iVar2 != 0 && iVar1 <= digits_after_point) {
      do {
        StringBuilder::AddCharacter(result_builder,'0');
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  else {
    StringBuilder::AddSubstring(result_builder,decimal_digits,length);
    iVar1 = decimal_point - length;
    if (iVar1 != 0 && length <= decimal_point) {
      do {
        StringBuilder::AddCharacter(result_builder,'0');
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
    if (0 < digits_after_point) {
      StringBuilder::AddCharacter(result_builder,'.');
      iVar1 = digits_after_point;
      do {
        StringBuilder::AddCharacter(result_builder,'0');
        iVar1 = iVar1 + -1;
      } while (iVar1 != 0);
    }
  }
  if (digits_after_point == 0) {
    if ((this->flags_ & 2) != 0) {
      StringBuilder::AddCharacter(result_builder,'.');
    }
    if ((this->flags_ & 4) != 0) {
      StringBuilder::AddCharacter(result_builder,'0');
      return;
    }
  }
  return;
}

Assistant:

void DoubleToStringConverter::CreateDecimalRepresentation(
    const char* decimal_digits,
    int length,
    int decimal_point,
    int digits_after_point,
    StringBuilder* result_builder) const {
  // Create a representation that is padded with zeros if needed.
  if (decimal_point <= 0) {
      // "0.00000decimal_rep".
    result_builder->AddCharacter('0');
    if (digits_after_point > 0) {
      result_builder->AddCharacter('.');
      result_builder->AddPadding('0', -decimal_point);
      ASSERT(length <= digits_after_point - (-decimal_point));
      result_builder->AddSubstring(decimal_digits, length);
      int remaining_digits = digits_after_point - (-decimal_point) - length;
      result_builder->AddPadding('0', remaining_digits);
    }
  } else if (decimal_point >= length) {
    // "decimal_rep0000.00000" or "decimal_rep.0000"
    result_builder->AddSubstring(decimal_digits, length);
    result_builder->AddPadding('0', decimal_point - length);
    if (digits_after_point > 0) {
      result_builder->AddCharacter('.');
      result_builder->AddPadding('0', digits_after_point);
    }
  } else {
    // "decima.l_rep000"
    ASSERT(digits_after_point > 0);
    result_builder->AddSubstring(decimal_digits, decimal_point);
    result_builder->AddCharacter('.');
    ASSERT(length - decimal_point <= digits_after_point);
    result_builder->AddSubstring(&decimal_digits[decimal_point],
                                 length - decimal_point);
    int remaining_digits = digits_after_point - (length - decimal_point);
    result_builder->AddPadding('0', remaining_digits);
  }
  if (digits_after_point == 0) {
    if ((flags_ & EMIT_TRAILING_DECIMAL_POINT) != 0) {
      result_builder->AddCharacter('.');
    }
    if ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) {
      result_builder->AddCharacter('0');
    }
  }
}